

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

void __thiscall Raytracer::Scene::start(Scene *this,Image *img)

{
  pointer ppSVar1;
  int iVar2;
  int y;
  int y_00;
  Shape **i;
  pointer ppSVar3;
  int x;
  int x_00;
  ulong uVar4;
  Vec3f VVar6;
  RGB color;
  vector<Raytracer::Shape_*,_std::allocator<Raytracer::Shape_*>_> *__range3;
  undefined1 local_70 [16];
  float local_60;
  undefined4 local_5c;
  Vec3f *local_58;
  Scene *local_50;
  undefined8 local_48;
  undefined4 local_40;
  Vec3f local_3c;
  undefined8 extraout_XMM0_Qa;
  float fVar5;
  
  local_58 = &(this->camera).origin;
  local_50 = this;
  for (y_00 = 0; y_00 < img->height; y_00 = y_00 + 1) {
    for (x_00 = 0; x_00 < img->width; x_00 = x_00 + 1) {
      local_70._12_4_ = (undefined4)x_00;
      local_5c = 0xbf800000;
      local_60 = (float)y_00;
      VVar6 = Camera::WorldToCamera((Camera *)local_70,local_58,(Image *)(local_70 + 0xc));
      local_48 = 0;
      local_40 = 0;
      local_3c.z = (float)local_70._8_4_;
      local_3c.x = (float)local_70._0_4_;
      local_3c.y = (float)local_70._4_4_;
      ppSVar1 = (local_50->objects).
                super__Vector_base<Raytracer::Shape_*,_std::allocator<Raytracer::Shape_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppSVar3 = (local_50->objects).
                     super__Vector_base<Raytracer::Shape_*,_std::allocator<Raytracer::Shape_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppSVar3 != ppSVar1;
          ppSVar3 = ppSVar3 + 1) {
        local_70._0_4_ = 0.0;
        local_70._4_4_ = 0.0;
        local_70._8_4_ = 0.0;
        iVar2 = (*(*ppSVar3)->_vptr_Shape[2])(VVar6._0_8_,*ppSVar3,&local_48,(Camera *)local_70);
        uVar4 = 0x437f0000;
        if ((char)iVar2 == '\0') {
          uVar4 = 0;
        }
        color.b = 0.0;
        color.r = (float)(int)uVar4;
        color.g = (float)(int)(uVar4 >> 0x20);
        fVar5 = 0.0;
        Image::Update(img,y_00,x_00,color);
        VVar6.z = fVar5;
        VVar6.x = (float)(int)extraout_XMM0_Qa;
        VVar6.y = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
      }
    }
  }
  return;
}

Assistant:

void Raytracer::Scene::start(Raytracer::Image & img) {
    for(int y = 0;y<img.height;y++){
        for(int x = 0;x<img.width;x++) {

            Raytracer::Ray ray(Vec3f(0,0,0),camera.WorldToCamera(Vec3f(x,y,-1),img));
            for(auto &i : objects){
                Vec3f usless;
                if(i->isRayIntersect(ray,usless)){
                    img.Update(y,x,RGB(255, 0, 0));
                }else{
                    img.Update(y,x,RGB(0, 0, 0));
                }
            }
        }
    }
}